

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall
gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
          (ImageSizeMachine *this,int stage,bool ms_and_1d,ivec4 *expected_result,bool subroutine)

{
  CallLogWrapper *pCVar1;
  bool bVar2;
  GLuint GVar3;
  uint stage_00;
  long lVar4;
  int i;
  ulong uVar5;
  char *glsl_fs;
  char *glsl_vs;
  int aiStack_b0 [2];
  string vs;
  char *glsl_tcs;
  
  stage_00 = (uint)ms_and_1d;
  if ((uint)stage < 5) {
    switch(stage) {
    case 0:
      GenShader<tcu::Vector<unsigned_int,4>>
                (&vs,(ImageSizeMachine *)0x0,(uint)ms_and_1d,subroutine,subroutine);
      glsl_vs = vs._M_dataplus._M_p;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv
                        ((CallLogWrapper *)(this + 8),0x8b31,1,&glsl_vs);
      *(GLuint *)(this + 0x2c) = GVar3;
      glu::CallLogWrapper::glUseProgramStages
                ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,GVar3);
      break;
    case 1:
      glsl_vs = "#version 430 core\nvoid main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
      glsl_fs = "#version 430 core\nlayout(quads, point_mode) in;\nvoid main() {}";
      GenShader<tcu::Vector<unsigned_int,4>>
                (&vs,(ImageSizeMachine *)&DAT_00000001,(uint)ms_and_1d,subroutine,subroutine);
      glsl_tcs = vs._M_dataplus._M_p;
      pCVar1 = (CallLogWrapper *)(this + 8);
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b31,1,&glsl_vs);
      *(GLuint *)(this + 0x2c) = GVar3;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8e88,1,&glsl_tcs);
      *(GLuint *)(this + 0x30) = GVar3;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8e87,1,&glsl_fs);
      *(GLuint *)(this + 0x34) = GVar3;
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),8,*(GLuint *)(this + 0x30));
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),0x10,*(GLuint *)(this + 0x34));
      break;
    case 2:
      glsl_vs = "#version 430 core\nvoid main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
      GenShader<tcu::Vector<unsigned_int,4>>
                (&vs,(ImageSizeMachine *)0x2,stage_00,subroutine,subroutine);
      glsl_fs = vs._M_dataplus._M_p;
      pCVar1 = (CallLogWrapper *)(this + 8);
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b31,1,&glsl_vs);
      *(GLuint *)(this + 0x2c) = GVar3;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8e87,1,&glsl_fs);
      *(GLuint *)(this + 0x30) = GVar3;
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),0x10,*(GLuint *)(this + 0x30));
      break;
    case 3:
      glsl_vs = "#version 430 core\nvoid main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
      GenShader<tcu::Vector<unsigned_int,4>>
                (&vs,(ImageSizeMachine *)0x3,stage_00,subroutine,subroutine);
      glsl_fs = vs._M_dataplus._M_p;
      pCVar1 = (CallLogWrapper *)(this + 8);
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b31,1,&glsl_vs);
      *(GLuint *)(this + 0x2c) = GVar3;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8dd9,1,&glsl_fs);
      *(GLuint *)(this + 0x30) = GVar3;
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
      glu::CallLogWrapper::glUseProgramStages
                (pCVar1,*(GLuint *)(this + 0x28),4,*(GLuint *)(this + 0x30));
      break;
    case 4:
      GenShader<tcu::Vector<unsigned_int,4>>
                (&vs,(ImageSizeMachine *)&DAT_00000004,stage_00,subroutine,subroutine);
      glsl_vs = vs._M_dataplus._M_p;
      GVar3 = glu::CallLogWrapper::glCreateShaderProgramv
                        ((CallLogWrapper *)(this + 8),0x91b9,1,&glsl_vs);
      *(GLuint *)(this + 0x2c) = GVar3;
      glu::CallLogWrapper::glUseProgramStages
                ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),0x20,GVar3);
    }
  }
  else {
    glsl_vs = "#version 430 core\nvoid main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
    GenShader<tcu::Vector<unsigned_int,4>>
              (&vs,(ImageSizeMachine *)0x5,stage_00,subroutine,subroutine);
    glsl_fs = vs._M_dataplus._M_p;
    pCVar1 = (CallLogWrapper *)(this + 8);
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b31,1,&glsl_vs);
    *(GLuint *)(this + 0x2c) = GVar3;
    GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar1,0x8b30,1,&glsl_fs);
    *(GLuint *)(this + 0x30) = GVar3;
    glu::CallLogWrapper::glUseProgramStages
              (pCVar1,*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    glu::CallLogWrapper::glUseProgramStages
              (pCVar1,*(GLuint *)(this + 0x28),2,*(GLuint *)(this + 0x30));
  }
  std::__cxx11::string::~string((string *)&vs);
  lVar4 = 0xb;
  while (lVar4 != 0xe) {
    bVar2 = gl4cts::anon_unknown_0::ImageSizeMachine::CheckProgram
                      ((ImageSizeMachine *)this,*(GLuint *)(this + lVar4 * 4));
    lVar4 = lVar4 + 1;
    if (!bVar2) {
      return -1;
    }
  }
  pCVar1 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,*(GLuint *)(this + 0x3c));
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
  lVar4 = 0;
  do {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)((long)&vs._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x70);
  for (lVar4 = 0; lVar4 != 0x70; lVar4 = lVar4 + 0x10) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&glsl_vs,100000);
    *(char **)((long)&vs._M_dataplus._M_p + lVar4) = glsl_vs;
    *(int (*) [2])((long)&vs._M_string_length + lVar4) = aiStack_b0;
  }
  glu::CallLogWrapper::glTexImage2D(pCVar1,0xde1,0,0x8d82,1,7,0,0x8d99,0x1404,&vs);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,0,*(GLuint *)(this + 0x3c),0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindProgramPipeline(pCVar1,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glBindVertexArray(pCVar1,*(GLuint *)(this + 0x38));
  if (stage != 5) {
    glu::CallLogWrapper::glEnable(pCVar1,0x8c89);
    if (stage - 1U < 2) {
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      goto LAB_00a9345d;
    }
    if (stage == 4) {
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      goto LAB_00a9345d;
    }
  }
  glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
LAB_00a9345d:
  glu::CallLogWrapper::glDisable(pCVar1,0x8c89);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,*(GLuint *)(this + 0x3c));
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
  lVar4 = 0;
  do {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)((long)&vs._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x70);
  glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x8d99,0x1404,&vs);
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    if (lVar4 == 0x70) {
      return 0;
    }
    bVar2 = tcu::Vector<int,_4>::operator!=
                      ((Vector<int,_4> *)((long)&vs._M_dataplus._M_p + lVar4),
                       (Vector<int,_4> *)((long)expected_result->m_data + lVar4));
    if (bVar2) break;
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  gl4cts::anon_unknown_0::Output
            ("Returned value is: (%d %d %d %d). Expected value is: (%d %d %d %d). Image unit is: %d.\n"
             ,(ulong)*(uint *)((long)&vs._M_dataplus._M_p + lVar4),
             (ulong)*(uint *)((long)&vs._M_dataplus._M_p + lVar4 + 4),
             (ulong)*(uint *)((long)&vs._M_string_length + lVar4),
             (ulong)*(uint *)((long)&vs._M_string_length + lVar4 + 4),
             (ulong)*(uint *)((long)expected_result->m_data + lVar4),
             (ulong)*(uint *)((long)expected_result->m_data + lVar4 + 4),
             (ulong)*(uint *)((long)expected_result->m_data + lVar4 + 8),
             (ulong)*(uint *)((long)expected_result->m_data + lVar4 + 0xc),(ulong)((int)uVar5 + 1));
  return -(ulong)(uVar5 < 7);
}

Assistant:

long Run(int stage, bool ms_and_1d, ivec4 expected_result[7], bool subroutine = false)
	{
		if (stage == 0)
		{ // VS
			std::string		  vs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_vs = vs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		}
		else if (stage == 1)
		{ // TCS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			const char* const glsl_tes = "#version 430 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			std::string		  tcs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_tcs = tcs.c_str();
			m_program[0]			   = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			   = glCreateShaderProgramv(GL_TESS_CONTROL_SHADER, 1, &glsl_tcs);
			m_program[2]			   = glCreateShaderProgramv(GL_TESS_EVALUATION_SHADER, 1, &glsl_tes);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_TESS_CONTROL_SHADER_BIT, m_program[1]);
			glUseProgramStages(m_pipeline, GL_TESS_EVALUATION_SHADER_BIT, m_program[2]);
		}
		else if (stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  tes	 = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_tes = tes.c_str();
			m_program[0]			   = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			   = glCreateShaderProgramv(GL_TESS_EVALUATION_SHADER, 1, &glsl_tes);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_TESS_EVALUATION_SHADER_BIT, m_program[1]);
		}
		else if (stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  gs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_gs = gs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			  = glCreateShaderProgramv(GL_GEOMETRY_SHADER, 1, &glsl_gs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_GEOMETRY_SHADER_BIT, m_program[1]);
		}
		else if (stage == 4)
		{ // CS
			std::string		  cs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_cs = cs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_cs);
			glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program[0]);
		}
		else if (stage == 5)
		{ // FS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  fs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_fs = fs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			  = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);
		}
		for (int i = 0; i < 3; ++i)
		{
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		{
			ivec4 data[7];
			for (int i  = 0; i < 7; ++i)
				data[i] = ivec4(100000);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32I, 1, 7, 0, GL_RGBA_INTEGER, GL_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32I);
		glBindProgramPipeline(m_pipeline);
		glBindVertexArray(m_vertex_array);
		if (stage != 5)
		{
			glEnable(GL_RASTERIZER_DISCARD);
		}
		if (stage == 1 || stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		glDisable(GL_RASTERIZER_DISCARD);

		glBindTexture(GL_TEXTURE_2D, m_texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		{
			ivec4 data[7];
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA_INTEGER, GL_INT, &data[0]);
			for (int i = 0; i < 7; ++i)
			{
				if (data[i] != expected_result[i])
				{
					Output("Returned value is: (%d %d %d %d). Expected value is: (%d %d %d %d). Image unit is: %d.\n",
						   data[i][0], data[i][1], data[i][2], data[i][3], expected_result[i][0], expected_result[i][1],
						   expected_result[i][2], expected_result[i][3], i + 1);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}